

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mappedio.c
# Opt level: O1

void prvTidyfreeFileSource(TidyInputSource *inp,Bool closeIt)

{
  undefined8 *puVar1;
  
  if (inp->getByte == mapped_getByte) {
    puVar1 = (undefined8 *)inp->sourceData;
    munmap((void *)puVar1[1],puVar1[3]);
    (**(code **)(*(long *)*puVar1 + 0x10))((long *)*puVar1,puVar1);
    return;
  }
  prvTidyfreeStdIOFileSource(inp,closeIt);
  return;
}

Assistant:

void TY_(freeFileSource)( TidyInputSource* inp, Bool closeIt )
{
    if ( inp->getByte == mapped_getByte )
    {
        MappedFileSource* fin = (MappedFileSource*) inp->sourceData;
        munmap( (void*)fin->base, fin->size );
        TidyFree( fin->allocator, fin );
    }
    else
        TY_(freeStdIOFileSource)( inp, closeIt );
}